

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cpp
# Opt level: O0

int main(void)

{
  AdsException *ex;
  runtime_error *ex_1;
  
  runExample((ostream *)&std::cout);
  std::operator<<((ostream *)&std::cout,"Hit ENTER to continue\n");
  std::istream::ignore();
  return 0;
}

Assistant:

int main()
{
    try {
        runExample(std::cout);
    } catch (const AdsException& ex) {
        std::cout << "Error: " << ex.errorCode << "\n";
        std::cout << "AdsException message: " << ex.what() << "\n";
    } catch (const std::runtime_error& ex) {
        std::cout << ex.what() << '\n';
    }
    std::cout << "Hit ENTER to continue\n";
    std::cin.ignore();
}